

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfRgbaFile.cpp
# Opt level: O3

void __thiscall Imf_3_4::RgbaInputFile::FromYca::readPixels(FromYca *this,int scanLine)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  ostream *poVar4;
  ArgExc *this_00;
  Rgba *pRVar5;
  Rgba *pRVar6;
  uint d;
  Rgba **ppRVar7;
  int iVar8;
  uint uVar9;
  undefined8 *puVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  int y;
  stringstream _iex_throw_s;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  if (this->_fbBase == (Rgba *)0x0) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream(local_1b8);
    std::__ostream_insert<char,std::char_traits<char>>
              (local_1a8,
               "No frame buffer was specified as the pixel data destination for image file \"",0x4c)
    ;
    pcVar3 = InputPart::fileName(this->_inputPart);
    poVar4 = std::operator<<(local_1a8,pcVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\".",2);
    this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_3_4::ArgExc::ArgExc(this_00,local_1b8);
    __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
  }
  iVar8 = this->_currentScanLine;
  d = scanLine - iVar8;
  uVar9 = -d;
  uVar11 = d;
  if ((int)d < 1) {
    uVar11 = uVar9;
  }
  if ((uVar11 < 0x1d) && (rotateBuf1(this,d), uVar11 < 3)) {
    rotateBuf2(this,d);
  }
  if ((int)d < 0) {
    ppRVar7 = this->_buf1;
    uVar2 = 0x1d;
    if (uVar9 < 0x1d) {
      uVar2 = (ulong)uVar9;
    }
    do {
      readYCAScanLine(this,scanLine + -0xf + (int)uVar2,this->_buf1[uVar2 - 1]);
      bVar1 = 1 < uVar2;
      uVar2 = uVar2 - 1;
    } while (bVar1);
    uVar11 = 3;
    if ((int)uVar9 < 3) {
      uVar11 = uVar9;
    }
    uVar2 = 1;
    if (1 < (int)uVar11) {
      uVar2 = (ulong)uVar11;
    }
    uVar12 = 0;
    do {
      iVar8 = this->_width;
      if (((int)uVar12 + scanLine & 1U) == 0) {
        RgbaYca::reconstructChromaVert(iVar8,ppRVar7,this->_buf2[uVar12]);
        iVar8 = this->_width;
        pRVar5 = this->_buf2[uVar12];
        pRVar6 = pRVar5;
      }
      else {
        pRVar6 = this->_buf1[uVar12 + 0xd];
        pRVar5 = this->_buf2[uVar12];
      }
      RgbaYca::YCAtoRGBA(&this->_yw,iVar8,pRVar6,pRVar5);
      uVar12 = uVar12 + 1;
      ppRVar7 = ppRVar7 + 1;
    } while (uVar2 != uVar12);
  }
  else if (scanLine != iVar8) {
    uVar2 = 0x1d;
    if (d < 0x1d) {
      uVar2 = (ulong)d;
    }
    uVar12 = uVar2 + 1;
    y = (scanLine - (int)uVar2) + 0xf;
    puVar10 = (undefined8 *)((long)this + (0x150 - (ulong)(uint)((int)uVar2 << 3)));
    do {
      readYCAScanLine(this,y,(Rgba *)*puVar10);
      uVar12 = uVar12 - 1;
      y = y + 1;
      puVar10 = puVar10 + 1;
    } while (1 < uVar12);
    if (scanLine != iVar8) {
      uVar11 = 3;
      if ((int)d < 3) {
        uVar11 = d;
      }
      ppRVar7 = this->_buf2 + 2;
      lVar13 = 2;
      do {
        iVar8 = this->_width;
        if (((int)lVar13 + scanLine & 1U) == 0) {
          RgbaYca::reconstructChromaVert(iVar8,ppRVar7 + -0x1d,*ppRVar7);
          iVar8 = this->_width;
          pRVar5 = *ppRVar7;
          pRVar6 = pRVar5;
        }
        else {
          pRVar6 = ppRVar7[-0x10];
          pRVar5 = *ppRVar7;
        }
        RgbaYca::YCAtoRGBA(&this->_yw,iVar8,pRVar6,pRVar5);
        lVar13 = lVar13 + -1;
        ppRVar7 = ppRVar7 + -1;
      } while ((int)(2 - uVar11) < lVar13);
    }
  }
  RgbaYca::fixSaturation(&this->_yw,this->_width,this->_buf2,this->_tmpBuf);
  if (0 < this->_width) {
    pRVar5 = this->_fbBase;
    lVar13 = 0;
    do {
      pRVar5[(this->_xMin + lVar13) * this->_fbXStride + this->_fbYStride * (long)scanLine] =
           this->_tmpBuf[lVar13];
      lVar13 = lVar13 + 1;
    } while (lVar13 < this->_width);
  }
  this->_currentScanLine = scanLine;
  return;
}

Assistant:

void
RgbaInputFile::FromYca::readPixels (int scanLine)
{
    if (_fbBase == 0)
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "No frame buffer was specified as the "
            "pixel data destination for image file "
            "\"" << _inputPart.fileName ()
                 << "\".");
    }

    //
    // In order to convert one scan line to RGB format, we need that
    // scan line plus N2+1 extra scan lines above and N2+1 scan lines
    // below in luminance/chroma format.
    //
    // We allow random access to scan lines, but we buffer partially
    // processed luminance/chroma data in order to make reading pixels
    // in increasing y or decreasing y order reasonably efficient:
    //
    //	_currentScanLine	holds the y coordinate of the scan line
    //				that was most recently read.
    //
    //	_buf1			contains scan lines _currentScanLine-N2-1
    //				through _currentScanLine+N2+1 in
    //				luminance/chroma format.  Odd-numbered
    //				lines contain no chroma data.  Even-numbered
    //				lines have valid chroma data for all pixels.
    //
    //  _buf2			contains scan lines _currentScanLine-1
    //  			through _currentScanLine+1, in RGB format.
    //				Super-saturated pixels (see ImfRgbaYca.h)
    //				have not yet been eliminated.
    //
    // If the scan line we are trying to read now is close enough to
    // _currentScanLine, we don't have to recompute the contents of _buf1
    // and _buf2 from scratch.  We can rotate _buf1 and _buf2, and fill
    // in the missing data.
    //

    int dy = scanLine - _currentScanLine;

    if (abs (dy) < N + 2) rotateBuf1 (dy);

    if (abs (dy) < 3) rotateBuf2 (dy);

    if (dy < 0)
    {
        {
            int n    = min (-dy, N + 2);
            int yMin = scanLine - N2 - 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMin + i, _buf1[i]);
        }

        {
            int n = min (-dy, 3);

            for (int i = 0; i < n; ++i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }
    else
    {
        {
            int n    = min (dy, N + 2);
            int yMax = scanLine + N2 + 1;

            for (int i = n - 1; i >= 0; --i)
                readYCAScanLine (yMax - i, _buf1[N + 1 - i]);
        }

        {
            int n = min (dy, 3);

            for (int i = 2; i > 2 - n; --i)
            {
                if ((scanLine + i) & 1)
                {
                    YCAtoRGBA (_yw, _width, _buf1[N2 + i], _buf2[i]);
                }
                else
                {
                    reconstructChromaVert (_width, _buf1 + i, _buf2[i]);
                    YCAtoRGBA (_yw, _width, _buf2[i], _buf2[i]);
                }
            }
        }
    }

    fixSaturation (_yw, _width, _buf2, _tmpBuf);

    intptr_t base = reinterpret_cast<intptr_t> (_fbBase);
    for (int i = 0; i < _width; ++i)
    {
        Rgba* ptr = reinterpret_cast<Rgba*> (
            base +
            sizeof (Rgba) * (_fbYStride * scanLine + _fbXStride * (i + _xMin)));
        *ptr = _tmpBuf[i];
    }
    _currentScanLine = scanLine;
}